

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O0

Dist * Omega_h::close_down(Dist *__return_storage_ptr__,Mesh *mesh,Remotes *old_use_owners,
                          Dist *elems2owners)

{
  Int IVar1;
  LO nrroots;
  Read<long> local_288;
  Dist local_278;
  undefined1 local_1e1;
  undefined1 local_1e0 [8];
  Read<long> old_owner_globals;
  undefined1 local_1b0 [24];
  Dist uses2old_owners;
  Remotes local_100;
  undefined1 local_e0 [8];
  Remotes new_use_owners;
  Dist owners2elems;
  int nverts_per_elem;
  Dist *elems2owners_local;
  Remotes *old_use_owners_local;
  Mesh *mesh_local;
  Dist *verts2owners;
  
  IVar1 = Mesh::dim(mesh);
  Dist::invert((Dist *)&new_use_owners.idxs.write_.shared_alloc_.direct_ptr,elems2owners);
  Remotes::Remotes(&local_100,old_use_owners);
  Dist::exch((Remotes *)local_e0,(Dist *)&new_use_owners.idxs.write_.shared_alloc_.direct_ptr,
             &local_100,IVar1 + 1);
  Remotes::~Remotes(&local_100);
  Mesh::comm((Mesh *)local_1b0);
  Remotes::Remotes((Remotes *)&old_owner_globals.write_.shared_alloc_.direct_ptr,(Remotes *)local_e0
                  );
  nrroots = Mesh::nents(mesh,0);
  Dist::Dist((Dist *)(local_1b0 + 0x10),(CommPtr *)local_1b0,
             (Remotes *)&old_owner_globals.write_.shared_alloc_.direct_ptr,nrroots);
  Remotes::~Remotes((Remotes *)&old_owner_globals.write_.shared_alloc_.direct_ptr);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_1b0);
  Mesh::globals((Mesh *)local_1e0,(Int)mesh);
  local_1e1 = 0;
  Dist::Dist(&local_278,(Dist *)(local_1b0 + 0x10));
  Read<long>::Read(&local_288,(Read<int> *)local_1e0);
  get_new_copies2old_owners(__return_storage_ptr__,&local_278,&local_288);
  Read<long>::~Read(&local_288);
  Dist::~Dist(&local_278);
  local_1e1 = 1;
  Read<long>::~Read((Read<long> *)local_1e0);
  Dist::~Dist((Dist *)(local_1b0 + 0x10));
  Remotes::~Remotes((Remotes *)local_e0);
  Dist::~Dist((Dist *)&new_use_owners.idxs.write_.shared_alloc_.direct_ptr);
  return __return_storage_ptr__;
}

Assistant:

static Dist close_down(Mesh* mesh, Remotes old_use_owners, Dist elems2owners) {
  auto nverts_per_elem = mesh->dim() + 1;
  auto owners2elems = elems2owners.invert();
  auto new_use_owners = owners2elems.exch(old_use_owners, nverts_per_elem);
  Dist uses2old_owners(mesh->comm(), new_use_owners, mesh->nents(VERT));
  auto old_owner_globals = mesh->globals(VERT);
  auto verts2owners =
      get_new_copies2old_owners(uses2old_owners, old_owner_globals);
  return verts2owners;
}